

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_comm.cpp
# Opt level: O3

CommPtr __thiscall Omega_h::Comm::graph_inverse(Comm *this)

{
  int *piVar1;
  Alloc *this_00;
  Alloc *this_01;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  Read<int> *in_RSI;
  CommPtr CVar3;
  Read<int> local_38;
  Alloc *local_28;
  Alloc *local_20;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var2;
  
  local_38.write_.shared_alloc_.alloc = (Alloc *)in_RSI[1].write_.shared_alloc_.direct_ptr;
  if (((ulong)local_38.write_.shared_alloc_.alloc & 7) == 0 &&
      local_38.write_.shared_alloc_.alloc != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_38.write_.shared_alloc_.alloc =
           (Alloc *)((local_38.write_.shared_alloc_.alloc)->size * 8 + 1);
    }
    else {
      (local_38.write_.shared_alloc_.alloc)->use_count =
           (local_38.write_.shared_alloc_.alloc)->use_count + 1;
    }
  }
  this_00 = local_38.write_.shared_alloc_.alloc;
  local_38.write_.shared_alloc_.direct_ptr = in_RSI[2].write_.shared_alloc_.alloc;
  local_28 = (Alloc *)(in_RSI->write_).shared_alloc_.direct_ptr;
  if (((ulong)local_28 & 7) == 0 && local_28 != (Alloc *)0x0) {
    if (entering_parallel == '\x01') {
      local_28 = (Alloc *)(local_28->size * 8 + 1);
    }
    else {
      local_28->use_count = local_28->use_count + 1;
    }
  }
  this_01 = local_28;
  local_20 = in_RSI[1].write_.shared_alloc_.alloc;
  CVar3 = graph_adjacent(this,in_RSI,&local_38);
  _Var2 = CVar3.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  if (((ulong)this_01 & 7) == 0 && this_01 != (Alloc *)0x0) {
    piVar1 = &this_01->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_01);
      operator_delete(this_01,0x48);
      _Var2._M_pi = extraout_RDX;
    }
  }
  if (((ulong)this_00 & 7) == 0 && this_00 != (Alloc *)0x0) {
    piVar1 = &this_00->use_count;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      Alloc::~Alloc(this_00);
      operator_delete(this_00,0x48);
      _Var2._M_pi = extraout_RDX_00;
    }
  }
  CVar3.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       _Var2._M_pi;
  CVar3.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>._M_ptr = this;
  return (CommPtr)CVar3.super___shared_ptr<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

CommPtr Comm::graph_inverse() const {
  return graph_adjacent(destinations(), sources());
}